

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O3

void skiwi::anon_unknown_26::fold_bitwise_or(PrimitiveCall *p,Expression *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Expression *e_00;
  bool bVar4;
  Fixnum f2;
  Fixnum f1;
  Literal lit2;
  Literal lit1;
  Fixnum f;
  Fixnum local_1d0;
  Fixnum local_188;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_140;
  undefined1 local_e0;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_d8;
  undefined1 local_78;
  Fixnum local_70;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0x1e0) {
    local_d8._32_8_ = local_d8._M_first._M_storage._M_storage + 0x30;
    local_d8._0_8_ = 0xffffffffffffffff;
    local_d8._M_first._M_storage._M_storage[9] = '\0';
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8._40_8_ = 0;
    local_d8._M_first._M_storage._M_storage[0x30] = '\0';
    local_78 = 0;
    local_140._32_8_ = local_140._M_first._M_storage._M_storage + 0x30;
    local_140._0_8_ = 0xffffffffffffffff;
    local_140._M_first._M_storage._M_storage[9] = '\0';
    local_140._16_8_ = 0;
    local_140._24_8_ = 0;
    local_140._40_8_ = 0;
    local_140._M_first._M_storage._M_storage[0x30] = '\0';
    local_e0 = 0;
    paVar2 = &local_188.filename.field_2;
    local_188.line_nr = -1;
    local_188.column_nr = -1;
    local_188.tail_position = false;
    local_188.pre_scan_index = 0;
    local_188.scan_index = 0;
    local_188.filename._M_string_length = 0;
    local_188.filename.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_1d0.filename.field_2;
    local_1d0.line_nr = -1;
    local_1d0.column_nr = -1;
    local_1d0.tail_position = false;
    local_1d0.pre_scan_index = 0;
    local_1d0.scan_index = 0;
    local_1d0.filename._M_string_length = 0;
    local_1d0.filename.field_2._M_local_buf[0] = '\0';
    local_1d0.filename._M_dataplus._M_p = (pointer)paVar1;
    local_188.filename._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = is_literal((Literal *)&local_d8._M_first,e_00);
    if (bVar4) {
      bVar4 = is_literal((Literal *)&local_140._M_first,
                         (p->arguments).
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      if (bVar4) {
        bVar4 = is_fixnum(&local_188,(Literal *)&local_d8._M_first);
        if (bVar4) {
          bVar4 = is_fixnum(&local_1d0,(Literal *)&local_140._M_first);
          if (bVar4) {
            local_70.value = local_1d0.value | local_188.value;
            paVar3 = &local_70.filename.field_2;
            local_70.line_nr = -1;
            local_70.column_nr = -1;
            local_70.tail_position = false;
            local_70.pre_scan_index = 0;
            local_70.scan_index = 0;
            local_70.filename._M_string_length = 0;
            local_70.filename.field_2._M_local_buf[0] = '\0';
            local_70.filename._M_dataplus._M_p = (pointer)paVar3;
            std::
            variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
            ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                         *)e,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.filename._M_dataplus._M_p != paVar3) {
              operator_delete(local_70.filename._M_dataplus._M_p,
                              CONCAT71(local_70.filename.field_2._M_allocated_capacity._1_7_,
                                       local_70.filename.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.filename._M_dataplus._M_p,
                      CONCAT71(local_1d0.filename.field_2._M_allocated_capacity._1_7_,
                               local_1d0.filename.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_188.filename._M_dataplus._M_p,
                      CONCAT71(local_188.filename.field_2._M_allocated_capacity._1_7_,
                               local_188.filename.field_2._M_local_buf[0]) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_140._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_d8._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0x484,
                "void skiwi::(anonymous namespace)::fold_bitwise_or(PrimitiveCall &, Expression &)")
  ;
}

Assistant:

void fold_bitwise_or(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 2);
    Literal lit1, lit2;
    Fixnum f1, f2;
    if (is_literal(lit1, p.arguments[0]) && is_literal(lit2, p.arguments[1]))
      {
      if (is_fixnum(f1, lit1) && is_fixnum(f2, lit2))
        {
        e = make_fixnum(f1.value | f2.value);
        }
      }
    }